

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void __thiscall
helics::HandleManager::addAlias(HandleManager *this,string_view interfaceName,string_view alias)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  string_view interfaceName_00;
  string_view interfaceName_01;
  string_view interfaceName_02;
  string_view interfaceName_03;
  string_view interfaceName_04;
  string_view interfaceName_05;
  string_view interfaceName_06;
  string_view interfaceName_07;
  bool bVar2;
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  _Var3;
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  _Var4;
  mapped_type *pmVar5;
  basic_string_view<char,_std::char_traits<char>_> *interfaceAlias;
  basic_string_view<char,_std::char_traits<char>_> *pbVar6;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  string_view interfaceName_08;
  string_view interfaceName_09;
  string_view interfaceName_10;
  string_view interfaceName_11;
  string_view interfaceName_12;
  string_view interfaceName_13;
  string_view interfaceName_14;
  string_view interfaceName_15;
  string_view interfaceName_16;
  string_view interfaceName_17;
  string_view alias_00;
  string_view alias_01;
  string_view alias_02;
  string_view alias_03;
  string_view alias_04;
  string_view alias_05;
  string_view alias_06;
  string_view alias_07;
  string_view alias_08;
  string_view alias_09;
  string_view alias_10;
  string_view alias_11;
  string_view alias_12;
  string_view alias_13;
  string_view alias_14;
  string_view alias_15;
  string_view alias_16;
  string_view alias_17;
  key_type local_48;
  size_t local_38;
  char *local_30;
  
  local_30 = interfaceName._M_str;
  local_38 = interfaceName._M_len;
  pVar7 = std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&this->alias_names);
  _Var3 = pVar7.first.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur;
  pVar7 = std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&this->alias_names,&local_38,pVar7._8_8_);
  _Var4 = pVar7.first.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur;
  interfaceName_08._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_08._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_00._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_00._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  bVar2 = addAliasName(this,interfaceName_08,alias_00);
  if (bVar2) {
    local_48._M_str =
         *(char **)((long)_Var4.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ._M_cur + 8);
    local_48._M_len =
         *(size_t *)
          ((long)_Var4.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur + 0x10);
    pmVar5 = std::__detail::
             _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->aliases,&local_48);
    pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)
             (pmVar5->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (basic_string_view<char,_std::char_traits<char>_> *)
                  (pmVar5->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      bVar2 = std::operator==(*pbVar6,alias);
      if (!bVar2) {
        interfaceName_00._M_len = pbVar6->_M_len;
        interfaceName_00._M_str = pbVar6->_M_str;
        alias_01._M_str =
             *(char **)((long)_Var4.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_01._M_len =
             *(size_t *)
              ((long)_Var4.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addPublicationAlias(this,interfaceName_00,alias_01);
        interfaceName_01._M_len = pbVar6->_M_len;
        interfaceName_01._M_str = pbVar6->_M_str;
        alias_02._M_str =
             *(char **)((long)_Var4.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_02._M_len =
             *(size_t *)
              ((long)_Var4.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addInputAlias(this,interfaceName_01,alias_02);
        interfaceName_02._M_len = pbVar6->_M_len;
        interfaceName_02._M_str = pbVar6->_M_str;
        alias_03._M_str =
             *(char **)((long)_Var4.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_03._M_len =
             *(size_t *)
              ((long)_Var4.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addEndpointAlias(this,interfaceName_02,alias_03);
        interfaceName_03._M_len = pbVar6->_M_len;
        interfaceName_03._M_str = pbVar6->_M_str;
        alias_04._M_str =
             *(char **)((long)_Var4.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_04._M_len =
             *(size_t *)
              ((long)_Var4.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addFilterAlias(this,interfaceName_03,alias_04);
      }
    }
  }
  interfaceName_09._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_09._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_05._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_05._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addPublicationAlias(this,interfaceName_09,alias_05);
  interfaceName_10._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_10._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_06._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_06._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addInputAlias(this,interfaceName_10,alias_06);
  interfaceName_11._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_11._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_07._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_07._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addEndpointAlias(this,interfaceName_11,alias_07);
  interfaceName_12._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_12._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_08._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_08._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addFilterAlias(this,interfaceName_12,alias_08);
  interfaceName_13._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_13._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_09._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_09._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  bVar2 = addAliasName(this,interfaceName_13,alias_09);
  if (bVar2) {
    local_48._M_str =
         *(char **)((long)_Var3.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ._M_cur + 8);
    local_48._M_len =
         *(size_t *)
          ((long)_Var3.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur + 0x10);
    pmVar5 = std::__detail::
             _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->aliases,&local_48);
    pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)
             (pmVar5->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (basic_string_view<char,_std::char_traits<char>_> *)
                  (pmVar5->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      bVar2 = std::operator==(*pbVar6,alias);
      if (!bVar2) {
        interfaceName_04._M_len = pbVar6->_M_len;
        interfaceName_04._M_str = pbVar6->_M_str;
        alias_10._M_str =
             *(char **)((long)_Var3.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_10._M_len =
             *(size_t *)
              ((long)_Var3.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addPublicationAlias(this,interfaceName_04,alias_10);
        interfaceName_05._M_len = pbVar6->_M_len;
        interfaceName_05._M_str = pbVar6->_M_str;
        alias_11._M_str =
             *(char **)((long)_Var3.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_11._M_len =
             *(size_t *)
              ((long)_Var3.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addInputAlias(this,interfaceName_05,alias_11);
        interfaceName_06._M_len = pbVar6->_M_len;
        interfaceName_06._M_str = pbVar6->_M_str;
        alias_12._M_str =
             *(char **)((long)_Var3.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_12._M_len =
             *(size_t *)
              ((long)_Var3.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addEndpointAlias(this,interfaceName_06,alias_12);
        interfaceName_07._M_len = pbVar6->_M_len;
        interfaceName_07._M_str = pbVar6->_M_str;
        alias_13._M_str =
             *(char **)((long)_Var3.
                              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ._M_cur + 8);
        alias_13._M_len =
             *(size_t *)
              ((long)_Var3.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur + 0x10);
        addFilterAlias(this,interfaceName_07,alias_13);
      }
    }
  }
  interfaceName_14._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_14._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_14._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_14._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addPublicationAlias(this,interfaceName_14,alias_14);
  interfaceName_15._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_15._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_15._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_15._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addInputAlias(this,interfaceName_15,alias_15);
  interfaceName_16._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_16._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_16._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_16._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addEndpointAlias(this,interfaceName_16,alias_16);
  interfaceName_17._M_str =
       *(char **)((long)_Var3.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  interfaceName_17._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  alias_17._M_str =
       *(char **)((long)_Var4.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur + 8);
  alias_17._M_len =
       *(size_t *)
        ((long)_Var4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur + 0x10);
  addFilterAlias(this,interfaceName_17,alias_17);
  return;
}

Assistant:

void HandleManager::addAlias(std::string_view interfaceName, std::string_view alias)
{
    // interfaceName needs to be stable to emplace here so we create a stable string in the aliases
    // map
    auto [aliasName, existing1] = alias_names.emplace(alias);
    auto [iName, existing2] = alias_names.emplace(interfaceName);
    const std::string& aliasStableName = *aliasName;
    const std::string& interfaceStableName = *iName;

    bool cascade = addAliasName(interfaceStableName, aliasStableName);

    if (cascade) {
        auto& aliasRange = aliases[interfaceStableName];
        for (auto& interfaceAlias : aliasRange) {
            if (interfaceAlias != alias) {
                addPublicationAlias(interfaceAlias, interfaceStableName);
                addInputAlias(interfaceAlias, interfaceStableName);
                addEndpointAlias(interfaceAlias, interfaceStableName);
                addFilterAlias(interfaceAlias, interfaceStableName);
            }
        }
    }

    // add aliases for existing interfaces
    addPublicationAlias(*iName, *aliasName);
    addInputAlias(*iName, *aliasName);
    addEndpointAlias(*iName, *aliasName);
    addFilterAlias(*iName, *aliasName);

    /** aliases should be reciprocal*/
    cascade = addAliasName(aliasStableName, interfaceStableName);

    if (cascade) {
        auto& aliasRange = aliases[aliasStableName];
        for (auto& interfaceAlias : aliasRange) {
            if (interfaceAlias != alias) {
                addPublicationAlias(interfaceAlias, aliasStableName);
                addInputAlias(interfaceAlias, aliasStableName);
                addEndpointAlias(interfaceAlias, aliasStableName);
                addFilterAlias(interfaceAlias, aliasStableName);
            }
        }
    }

    // add aliases for existing interfaces
    addPublicationAlias(*aliasName, *iName);
    addInputAlias(*aliasName, *iName);
    addEndpointAlias(*aliasName, *iName);
    addFilterAlias(*aliasName, *iName);
}